

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestInterface.cpp
# Opt level: O1

void RunUtilityTests(void)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  FastVector<unsigned_int,_false,_false> arr;
  FastVector<unsigned_int,_false,_false> local_48;
  uint local_2c;
  
  if (Tests::messageVerbose == '\x01') {
    puts("FastVector test 1\r");
  }
  testsCount[3] = testsCount[3] + 1;
  local_48.data = (uint *)0x0;
  local_48.max = 0;
  local_48.count = 0;
  local_2c = 1;
  FastVector<unsigned_int,_false,_false>::grow_and_add(&local_48,0,&local_2c);
  iVar4 = 0x400;
  do {
    uVar2 = (ulong)local_48.count;
    if (uVar2 == 0) goto LAB_0017f808;
    uVar1 = local_48.count - 1;
    if (local_48.count == local_48.max) {
      FastVector<unsigned_int,_false,_false>::grow_and_add
                (&local_48,local_48.count,local_48.data + uVar1);
    }
    else {
      local_48.count = local_48.count + 1;
      local_48.data[uVar2] = local_48.data[uVar1];
    }
    if (local_48.count == 0) goto LAB_0017f827;
    local_48.data[local_48.count - 1] = local_48.data[local_48.count - 1] + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (uVar3 == 0x400) {
      bVar5 = true;
      goto LAB_0017f6bb;
    }
    if (local_48.count == uVar3) goto LAB_0017f808;
    uVar2 = uVar3 + 1;
  } while (uVar2 == local_48.data[uVar3]);
  bVar5 = 0x3ff < uVar3;
  if (Tests::messageVerbose == '\0') {
    puts("FastVector test 1\r");
  }
  if ((uint)uVar3 < local_48.count) {
    printf("Failed %d != %d\n",(ulong)local_48.data[uVar3],uVar2 & 0xffffffff);
    if (0x3ff < uVar3) {
LAB_0017f6bb:
      testsPassed[3] = testsPassed[3] + 1;
    }
    if (local_48.data != (uint *)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    if (bVar5) {
      if (Tests::messageVerbose == '\x01') {
        puts("FastVector test 2\r");
      }
      testsCount[3] = testsCount[3] + 1;
      local_48.data = (uint *)0x0;
      local_48.max = 0;
      local_48.count = 0;
      local_2c = 1;
      FastVector<unsigned_int,_false,_false>::grow_and_add(&local_48,0,&local_2c);
      iVar4 = 0x400;
      do {
        uVar2 = (ulong)local_48.count;
        if (uVar2 == 0) goto LAB_0017f808;
        uVar1 = local_48.count - 1;
        if (local_48.count == local_48.max) {
          FastVector<unsigned_int,_false,_false>::grow_and_add
                    (&local_48,local_48.count,local_48.data + uVar1);
        }
        else {
          local_48.count = local_48.count + 1;
          local_48.data[uVar2] = local_48.data[uVar1];
        }
        if (local_48.count == 0) {
LAB_0017f827:
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Array.h"
                        ,0x62,
                        "T &FastVector<unsigned int>::back() [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        local_48.data[local_48.count - 1] = local_48.data[local_48.count - 1] + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      uVar2 = 0;
      do {
        uVar3 = uVar2;
        if (uVar3 == 0x400) {
          testsPassed[3] = testsPassed[3] + 1;
          goto LAB_0017f7e9;
        }
        if (local_48.count == uVar3) goto LAB_0017f808;
        uVar2 = uVar3 + 1;
      } while (uVar2 == local_48.data[uVar3]);
      if (Tests::messageVerbose == '\0') {
        puts("FastVector test 2\r");
      }
      if (local_48.count <= (uint)uVar3) goto LAB_0017f808;
      printf("Failed %d != %d\n",(ulong)local_48.data[uVar3],uVar2 & 0xffffffff);
LAB_0017f7e9:
      if (local_48.data != (uint *)0x0) {
        (*(code *)NULLC::dealloc)();
      }
    }
    return;
  }
LAB_0017f808:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Array.h"
                ,0x7f,
                "T &FastVector<unsigned int>::operator[](unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void RunUtilityTests()
{
	{
		if(Tests::messageVerbose)
			printf("FastVector test 1\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 1\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}

	{
		if(Tests::messageVerbose)
			printf("FastVector test 2\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 2\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}
}